

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O0

void __thiscall
mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::section_timer_impl
          (section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *this,
          ostream *outstream,MPI_Comm comm,int root)

{
  rep_conflict rVar1;
  allocator local_25;
  int local_24;
  MPI_Comm poStack_20;
  int root_local;
  MPI_Comm comm_local;
  ostream *outstream_local;
  section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *this_local;
  
  this->_vptr_section_timer_impl = (_func_int **)&PTR__section_timer_impl_001bca58;
  this->ostr = outstream;
  this->comm = comm;
  this->root = root;
  local_24 = root;
  poStack_20 = comm;
  comm_local = (MPI_Comm)outstream;
  outstream_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->sep,"\t",&local_25);
  std::allocator<char>::~allocator((allocator<char> *)&local_25);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->start);
  MPI_Barrier(poStack_20);
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->start).__d.__r = rVar1;
  section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth =
       section_timer_impl<std::chrono::duration<double,std::ratio<1l,1000l>>>::depth + 1;
  return;
}

Assistant:

section_timer_impl(std::ostream& outstream = std::cerr, MPI_Comm comm = MPI_COMM_WORLD, int root = 0)
      : ostr(outstream), comm(comm), root(root), sep("\t") {
        // sync on barrier
        MPI_Barrier(comm);
        start = std::chrono::steady_clock::now();
        section_timer_impl::depth++;
    }